

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void convert_buffer(DString *buffer,short format,_Bool array_out)

{
  DString *local_20;
  DString *out;
  _Bool array_out_local;
  short format_local;
  DString *buffer_local;
  
  if (buffer != (DString *)0x0) {
    local_20 = d_string_new("");
    if (format == 0) {
      local_20 = csv_to_json(buffer,array_out);
    }
    else if (format == 1) {
      local_20 = tsv_to_json(buffer,array_out);
    }
    if (local_20 != (DString *)0x0) {
      fwrite(local_20->str,local_20->currentStringLength,1,_stdout);
    }
    d_string_free(local_20,true);
  }
  return;
}

Assistant:

void convert_buffer(DString * buffer, short format, bool array_out) {
	if (buffer) {
		DString * out = d_string_new("");

		switch (format) {
			case FORMAT_CSV:
				out = csv_to_json(buffer, array_out);
				break;

			case FORMAT_TSV:
				out = tsv_to_json(buffer, array_out);
				break;
		}

		if (out) {
			fwrite(out->str, out->currentStringLength, 1, stdout);
		}

		d_string_free(out, true);
	}
}